

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O0

int run_test_thread_stack_size_explicit(void)

{
  int iVar1;
  long lVar2;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_thread_options_t options;
  uv_thread_t thread;
  
  eval_a._0_4_ = 1;
  options.flags = 0x100000;
  options._4_4_ = 0;
  iVar1 = uv_thread_create_ex(&options.stack_size,(uv_thread_options_t *)&eval_a,thread_check_stack,
                              (uv_thread_options_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0x103,"uv_thread_create_ex(&thread, &options, thread_check_stack, &options)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_thread_join(&options.stack_size);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0x104,"uv_thread_join(&thread)","==","0",(long)iVar1,"==",0);
    abort();
  }
  options.flags = 0x800000;
  options._4_4_ = 0;
  iVar1 = uv_thread_create_ex(&options.stack_size,(uv_thread_options_t *)&eval_a,thread_check_stack,
                              (uv_thread_options_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0x108,"uv_thread_create_ex(&thread, &options, thread_check_stack, &options)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_thread_join(&options.stack_size);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0x109,"uv_thread_join(&thread)","==","0",(long)iVar1,"==",0);
    abort();
  }
  options.flags = 0;
  options._4_4_ = 0;
  iVar1 = uv_thread_create_ex(&options.stack_size,(uv_thread_options_t *)&eval_a,thread_check_stack,
                              (uv_thread_options_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0x10d,"uv_thread_create_ex(&thread, &options, thread_check_stack, &options)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_thread_join(&options.stack_size);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0x10e,"uv_thread_join(&thread)","==","0",(long)iVar1,"==",0);
    abort();
  }
  options.flags = 0x2a;
  options._4_4_ = 0;
  iVar1 = uv_thread_create_ex(&options.stack_size,(uv_thread_options_t *)&eval_a,thread_check_stack,
                              (uv_thread_options_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0x112,"uv_thread_create_ex(&thread, &options, thread_check_stack, &options)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_thread_join(&options.stack_size);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0x113,"uv_thread_join(&thread)","==","0",(long)iVar1,"==",0);
    abort();
  }
  lVar2 = __sysconf(0x4b);
  options._0_8_ = lVar2 + -0x2a;
  iVar1 = uv_thread_create_ex(&options.stack_size,(uv_thread_options_t *)&eval_a,thread_check_stack,
                              (uv_thread_options_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0x118,"uv_thread_create_ex(&thread, &options, thread_check_stack, &options)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_thread_join(&options.stack_size);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0x119,"uv_thread_join(&thread)","==","0",(long)iVar1,"==",0);
    abort();
  }
  lVar2 = __sysconf(0x4b);
  options._0_8_ = lVar2 / 2 + -0x2a;
  iVar1 = uv_thread_create_ex(&options.stack_size,(uv_thread_options_t *)&eval_a,thread_check_stack,
                              (uv_thread_options_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0x11d,"uv_thread_create_ex(&thread, &options, thread_check_stack, &options)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_thread_join(&options.stack_size);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0x11e,"uv_thread_join(&thread)","==","0",(long)iVar1,"==",0);
    abort();
  }
  options.flags = 0x12d687;
  options._4_4_ = 0;
  iVar1 = uv_thread_create_ex(&options.stack_size,(uv_thread_options_t *)&eval_a,thread_check_stack,
                              (uv_thread_options_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0x124,"uv_thread_create_ex(&thread, &options, thread_check_stack, &options)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_thread_join(&options.stack_size);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0x125,"uv_thread_join(&thread)","==","0",(long)iVar1,"==",0);
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(thread_stack_size_explicit) {
  uv_thread_t thread;
  uv_thread_options_t options;

  options.flags = UV_THREAD_HAS_STACK_SIZE;
  options.stack_size = 1024 * 1024;
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  options.stack_size = 8 * 1024 * 1024;  /* larger than most default os sizes */
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  options.stack_size = 0;
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  options.stack_size = 42;
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

#ifdef PTHREAD_STACK_MIN
  options.stack_size = PTHREAD_STACK_MIN - 42;  /* unaligned size */
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  options.stack_size = PTHREAD_STACK_MIN / 2 - 42;  /* unaligned size */
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));
#endif

  /* unaligned size, should be larger than PTHREAD_STACK_MIN */
  options.stack_size = 1234567;
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  return 0;
}